

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaSSModel.cpp
# Opt level: O2

void __thiscall
NaStateSpaceModel::NaStateSpaceModel(NaStateSpaceModel *this,NaStateSpaceModel *orig)

{
  uint uVar1;
  
  NaUnit::NaUnit(&this->super_NaUnit,&orig->super_NaUnit);
  NaConfigPart::NaConfigPart(&this->super_NaConfigPart,&orig->super_NaConfigPart);
  (this->super_NaUnit).super_NaLogging._vptr_NaLogging = (_func_int **)&PTR_PrintLog_00178590;
  (this->super_NaConfigPart)._vptr_NaConfigPart = (_func_int **)&PTR__NaStateSpaceModel_00178680;
  uVar1 = orig->m;
  this->n = orig->n;
  this->m = uVar1;
  this->k = orig->k;
  NaMatrix::NaMatrix(&this->A,&orig->A);
  NaMatrix::NaMatrix(&this->B,&orig->B);
  NaMatrix::NaMatrix(&this->C,&orig->C);
  NaMatrix::NaMatrix(&this->D,&orig->D);
  NaVector::NaVector(&this->x,&orig->x);
  NaVector::NaVector(&this->x0,&orig->x0);
  NaUnit::Assign(&this->super_NaUnit,this->k,this->m,0);
  return;
}

Assistant:

NaStateSpaceModel::NaStateSpaceModel (const NaStateSpaceModel& orig)
    : NaUnit(orig),
      A(orig.A), B(orig.B), C(orig.C), D(orig.D), x(orig.x), x0(orig.x0),
      n(orig.n), m(orig.m), k(orig.k),
      NaConfigPart(orig)
{
    Assign(k, m);
}